

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

TEXTURE_FORMAT Diligent::UnormFormatToSRGB(TEXTURE_FORMAT Fmt)

{
  TEXTURE_FORMAT local_a;
  TEXTURE_FORMAT Fmt_local;
  
  switch(Fmt) {
  case TEX_FORMAT_RGBA8_UNORM:
    local_a = TEX_FORMAT_RGBA8_UNORM_SRGB;
    break;
  default:
    local_a = Fmt;
    break;
  case TEX_FORMAT_BC1_UNORM:
    local_a = TEX_FORMAT_BC1_UNORM_SRGB;
    break;
  case TEX_FORMAT_BC2_UNORM:
    local_a = TEX_FORMAT_BC2_UNORM_SRGB;
    break;
  case TEX_FORMAT_BC3_UNORM:
    local_a = TEX_FORMAT_BC3_UNORM_SRGB;
    break;
  case TEX_FORMAT_BGRA8_UNORM:
    local_a = TEX_FORMAT_BGRA8_UNORM_SRGB;
    break;
  case TEX_FORMAT_BGRX8_UNORM:
    local_a = TEX_FORMAT_BGRX8_UNORM_SRGB;
    break;
  case TEX_FORMAT_BC7_UNORM:
    local_a = TEX_FORMAT_BC7_UNORM_SRGB;
    break;
  case TEX_FORMAT_ETC2_RGB8_UNORM:
    local_a = TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;
    break;
  case TEX_FORMAT_ETC2_RGB8A1_UNORM:
    local_a = TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;
    break;
  case TEX_FORMAT_ETC2_RGBA8_UNORM:
    local_a = TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;
  }
  return local_a;
}

Assistant:

TEXTURE_FORMAT UnormFormatToSRGB(TEXTURE_FORMAT Fmt)
{
    static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please update the switch below to handle the new texture format, if needed");
    switch (Fmt)
    {
        case TEX_FORMAT_RGBA8_UNORM:
            return TEX_FORMAT_RGBA8_UNORM_SRGB;

        case TEX_FORMAT_BC1_UNORM:
            return TEX_FORMAT_BC1_UNORM_SRGB;

        case TEX_FORMAT_BC2_UNORM:
            return TEX_FORMAT_BC2_UNORM_SRGB;

        case TEX_FORMAT_BC3_UNORM:
            return TEX_FORMAT_BC3_UNORM_SRGB;

        case TEX_FORMAT_BGRA8_UNORM:
            return TEX_FORMAT_BGRA8_UNORM_SRGB;

        case TEX_FORMAT_BGRX8_UNORM:
            return TEX_FORMAT_BGRX8_UNORM_SRGB;

        case TEX_FORMAT_BC7_UNORM:
            return TEX_FORMAT_BC7_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGB8_UNORM:
            return TEX_FORMAT_ETC2_RGB8_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGB8A1_UNORM:
            return TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB;

        case TEX_FORMAT_ETC2_RGBA8_UNORM:
            return TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB;

        default:
            return Fmt;
    }
}